

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O0

void __thiscall FStringTable::FreeData(FStringTable *this)

{
  StringEntry *pSVar1;
  StringEntry *next;
  StringEntry *entry;
  int i;
  FStringTable *this_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < 0x80; entry._4_4_ = entry._4_4_ + 1) {
    next = this->Buckets[entry._4_4_];
    this->Buckets[entry._4_4_] = (StringEntry *)0x0;
    while (next != (StringEntry *)0x0) {
      pSVar1 = next->Next;
      M_Free(next);
      next = pSVar1;
    }
  }
  return;
}

Assistant:

void FStringTable::FreeData ()
{
	for (int i = 0; i < HASH_SIZE; ++i)
	{
		StringEntry *entry = Buckets[i], *next;
		Buckets[i] = NULL;
		while (entry != NULL)
		{
			next = entry->Next;
			M_Free (entry);
			entry = next;
		}
	}
}